

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

void __thiscall MarkerIndex::rotate_node_right(MarkerIndex *this,Node *rotation_pivot)

{
  Node *pNVar1;
  bool bVar2;
  reference puVar3;
  size_t sVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  iterator it_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  iterator it;
  Node *rotation_root;
  Node *rotation_pivot_local;
  MarkerIndex *this_local;
  
  pNVar1 = rotation_pivot->parent;
  if (pNVar1->parent == (Node *)0x0) {
    this->root = rotation_pivot;
  }
  else if (pNVar1->parent->left == pNVar1) {
    pNVar1->parent->left = rotation_pivot;
  }
  else {
    pNVar1->parent->right = rotation_pivot;
  }
  rotation_pivot->parent = pNVar1->parent;
  pNVar1->left = rotation_pivot->right;
  if (pNVar1->left != (Node *)0x0) {
    pNVar1->left->parent = pNVar1;
  }
  rotation_pivot->right = pNVar1;
  pNVar1->parent = rotation_pivot;
  it._M_current = (uint *)Point::traversal(&pNVar1->left_extent,&rotation_pivot->left_extent);
  pNVar1->left_extent = (Point)it._M_current;
  local_30._M_current = (uint *)flat_set<unsigned_int>::begin(&pNVar1->left_marker_ids);
  while( true ) {
    it_1 = flat_set<unsigned_int>::end(&pNVar1->left_marker_ids);
    bVar2 = __gnu_cxx::operator!=(&local_30,&it_1);
    if (!bVar2) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_30);
    sVar4 = flat_set<unsigned_int>::count(&rotation_pivot->start_marker_ids,*puVar3);
    if (sVar4 == 0) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_30);
      flat_set<unsigned_int>::insert(&rotation_pivot->left_marker_ids,*puVar3);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_30);
  }
  local_40._M_current = (uint *)flat_set<unsigned_int>::begin(&rotation_pivot->right_marker_ids);
  while( true ) {
    local_48._M_current = (uint *)flat_set<unsigned_int>::end(&rotation_pivot->right_marker_ids);
    bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar2) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_40);
    sVar4 = flat_set<unsigned_int>::count(&pNVar1->right_marker_ids,*puVar3);
    if (sVar4 == 0) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_40);
      flat_set<unsigned_int>::insert(&pNVar1->left_marker_ids,*puVar3);
      local_40._M_current =
           (uint *)flat_set<unsigned_int>::erase(&rotation_pivot->right_marker_ids,&local_40);
    }
    else {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_40);
      flat_set<unsigned_int>::erase(&pNVar1->right_marker_ids,*puVar3);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_40);
    }
  }
  return;
}

Assistant:

void MarkerIndex::rotate_node_right(Node *rotation_pivot) {
  Node *rotation_root = rotation_pivot->parent;

  if (rotation_root->parent) {
    if (rotation_root->parent->left == rotation_root) {
      rotation_root->parent->left = rotation_pivot;
    } else {
      rotation_root->parent->right = rotation_pivot;
    }
  } else {
    root = rotation_pivot;
  }
  rotation_pivot->parent = rotation_root->parent;

  rotation_root->left = rotation_pivot->right;
  if (rotation_root->left) {
    rotation_root->left->parent = rotation_root;
  }

  rotation_pivot->right = rotation_root;
  rotation_root->parent = rotation_pivot;

  rotation_root->left_extent = rotation_root->left_extent.traversal(rotation_pivot->left_extent);

  for (auto it = rotation_root->left_marker_ids.begin(); it != rotation_root->left_marker_ids.end(); ++it) {
    if (!rotation_pivot->start_marker_ids.count(*it)) {
      rotation_pivot->left_marker_ids.insert(*it);
    }
  }

  for (auto it = rotation_pivot->right_marker_ids.begin(); it != rotation_pivot->right_marker_ids.end();) {
    if (rotation_root->right_marker_ids.count(*it)) {
      rotation_root->right_marker_ids.erase(*it);
      ++it;
    } else {
      rotation_root->left_marker_ids.insert(*it);
      it = rotation_pivot->right_marker_ids.erase(it);
    }
  }
}